

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcFont.cpp
# Opt level: O0

bool __thiscall GrcFont::IsGraphiteFont(GrcFont *this,void *pHdr,void *pTableDir)

{
  bool bVar1;
  size_t *in_RDI;
  void *unaff_retaddr;
  size_t lnSize;
  size_t lnOffset;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = TtfUtil::GetTableInfo
                    ((TableId)lnOffset,(void *)lnSize,unaff_retaddr,
                     (size_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI)
  ;
  if (bVar1) {
    bVar1 = true;
  }
  else {
    bVar1 = TtfUtil::GetTableInfo
                      ((TableId)lnOffset,(void *)lnSize,unaff_retaddr,
                       (size_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                       in_RDI);
    if (bVar1) {
      bVar1 = true;
    }
    else {
      bVar1 = TtfUtil::GetTableInfo
                        ((TableId)lnOffset,(void *)lnSize,unaff_retaddr,
                         (size_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         in_RDI);
      if (bVar1) {
        bVar1 = true;
      }
      else {
        bVar1 = TtfUtil::GetTableInfo
                          ((TableId)lnOffset,(void *)lnSize,unaff_retaddr,
                           (size_t *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                           in_RDI);
        if (bVar1) {
          bVar1 = true;
        }
        else {
          bVar1 = false;
        }
      }
    }
  }
  return bVar1;
}

Assistant:

bool GrcFont::IsGraphiteFont(void * pHdr, void * pTableDir)
{
	size_t lnOffset, lnSize;

	if (TtfUtil::GetTableInfo(ktiSilf, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiGloc, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiGlat, pHdr, pTableDir, lnOffset, lnSize))
		return true;
	if (TtfUtil::GetTableInfo(ktiFeat, pHdr, pTableDir, lnOffset, lnSize))
		return true;

	return false;
}